

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

bool embree::sse2::InstanceIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  float fVar1;
  Instance *pIVar2;
  RTCRayQueryContext *pRVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  bool bVar27;
  RayQueryContext newcontext;
  
  pIVar2 = prim->instance;
  if (((ray->mask & (pIVar2->super_Geometry).mask) == 0) ||
     (pRVar3 = context->user, pRVar3->instID[0] != 0xffffffff)) {
    bVar27 = false;
  }
  else {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = 0;
    fVar5 = (pIVar2->world2local0).l.vx.field_0.m128[0];
    fVar6 = (pIVar2->world2local0).l.vx.field_0.m128[1];
    fVar7 = (pIVar2->world2local0).l.vx.field_0.m128[2];
    fVar8 = (pIVar2->world2local0).l.vy.field_0.m128[0];
    fVar9 = (pIVar2->world2local0).l.vy.field_0.m128[1];
    fVar10 = (pIVar2->world2local0).l.vy.field_0.m128[2];
    fVar11 = (pIVar2->world2local0).l.vz.field_0.m128[0];
    fVar12 = (pIVar2->world2local0).l.vz.field_0.m128[1];
    fVar13 = (pIVar2->world2local0).l.vz.field_0.m128[2];
    fVar14 = (ray->org).field_0.m128[0];
    fVar15 = (ray->org).field_0.m128[1];
    uVar23 = *(undefined8 *)&(ray->org).field_0;
    pfVar17 = (ray->org).field_0.m128 + 2;
    fVar16 = *pfVar17;
    uVar24 = *(undefined8 *)pfVar17;
    fVar18 = (ray->dir).field_0.m128[0];
    fVar19 = (ray->dir).field_0.m128[1];
    uVar25 = *(undefined8 *)&(ray->dir).field_0;
    pfVar17 = (ray->dir).field_0.m128 + 2;
    fVar20 = *pfVar17;
    uVar26 = *(undefined8 *)pfVar17;
    fVar21 = (pIVar2->world2local0).p.field_0.m128[1];
    fVar22 = (pIVar2->world2local0).p.field_0.m128[2];
    fVar1 = (ray->org).field_0.m128[3];
    (ray->org).field_0.m128[0] =
         fVar14 * fVar5 +
         fVar15 * fVar8 + fVar16 * fVar11 + (pIVar2->world2local0).p.field_0.m128[0];
    (ray->org).field_0.m128[1] = fVar14 * fVar6 + fVar15 * fVar9 + fVar16 * fVar12 + fVar21;
    (ray->org).field_0.m128[2] = fVar14 * fVar7 + fVar15 * fVar10 + fVar16 * fVar13 + fVar22;
    (ray->org).field_0.m128[3] = fVar1;
    fVar1 = (ray->dir).field_0.m128[3];
    (ray->dir).field_0.m128[0] = fVar18 * fVar5 + fVar19 * fVar8 + fVar20 * fVar11;
    (ray->dir).field_0.m128[1] = fVar18 * fVar6 + fVar19 * fVar9 + fVar20 * fVar12;
    (ray->dir).field_0.m128[2] = fVar18 * fVar7 + fVar19 * fVar10 + fVar20 * fVar13;
    (ray->dir).field_0.m128[3] = fVar1;
    lVar4 = *(long *)&(pIVar2->super_Geometry).field_0x58;
    (**(code **)(lVar4 + 0x80))(lVar4 + 0x58,ray);
    *(undefined8 *)&(ray->org).field_0 = uVar23;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uVar24;
    *(undefined8 *)&(ray->dir).field_0 = uVar25;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uVar26;
    bVar27 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return bVar27;
}

Assistant:

bool InstanceIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local();
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }